

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

Status cmSystemTools::CreateSymlink(string *origName,string *newName)

{
  Status status;
  Status local_58;
  string local_50;
  string local_30;
  
  local_58 = CreateSymlinkQuietly(origName,newName);
  if (local_58.Kind_ != Success) {
    cmsys::Status::GetString_abi_cxx11_(&local_30,&local_58);
    cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
              (&local_50,(char (*) [33])"failed to create symbolic link \'",newName,
               (char (*) [4])0x6b9fd2,&local_30);
    Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return local_58;
}

Assistant:

cmsys::Status cmSystemTools::CreateSymlink(std::string const& origName,
                                           std::string const& newName)
{
  cmsys::Status status =
    cmSystemTools::CreateSymlinkQuietly(origName, newName);
  if (!status) {
    cmSystemTools::Error(cmStrCat("failed to create symbolic link '", newName,
                                  "': ", status.GetString()));
  }
  return status;
}